

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.cpp
# Opt level: O2

void __thiscall
TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
          (ParticleSwarmState *this,vector<double,_std::allocator<double>_> *box_lower,
          vector<double,_std::allocator<double>_> *box_upper,function<double_()> *get_random01)

{
  double *box_lower_00;
  double *box_upper_00;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  function<double_()> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"ParticleSwarmState::initializeParticlesInsideBox",&local_c9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"box lower bounds",&local_ca);
  checkVarSize(&local_68,&local_88,
               (int)((ulong)((long)(box_lower->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(box_lower->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3),
               this->num_dimensions);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"ParticleSwarmState::initializeParticlesInsideBox",&local_c9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"box upper bounds",&local_ca);
  checkVarSize(&local_a8,&local_c8,
               (int)((ulong)((long)(box_upper->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(box_upper->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3),
               this->num_dimensions);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  box_lower_00 = (box_lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  box_upper_00 = (box_upper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  std::function<double_()>::function(&local_48,get_random01);
  initializeParticlesInsideBox(this,box_lower_00,box_upper_00,&local_48);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  return;
}

Assistant:

void ParticleSwarmState::initializeParticlesInsideBox(const std::vector<double> &box_lower, const std::vector<double> &box_upper,
                                                      const std::function<double(void)> get_random01) {
    checkVarSize("ParticleSwarmState::initializeParticlesInsideBox", "box lower bounds", box_lower.size(), num_dimensions);
    checkVarSize("ParticleSwarmState::initializeParticlesInsideBox", "box upper bounds", box_upper.size(), num_dimensions);
    ParticleSwarmState::initializeParticlesInsideBox(box_lower.data(), box_upper.data(), get_random01);
}